

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_insn.c
# Opt level: O0

int pt_insn_is_ptwrite(pt_insn *insn,pt_insn_ext *iext)

{
  pt_insn_ext *iext_local;
  pt_insn *insn_local;
  
  if (insn == (pt_insn *)0x0) {
    insn_local._4_4_ = 0;
  }
  else if (insn->iclass == ptic_ptwrite) {
    insn_local._4_4_ = 1;
  }
  else {
    insn_local._4_4_ = 0;
  }
  return insn_local._4_4_;
}

Assistant:

int pt_insn_is_ptwrite(const struct pt_insn *insn,
		       const struct pt_insn_ext *iext)
{
	(void) iext;

	if (!insn)
		return 0;

	switch (insn->iclass) {
	default:
		return 0;

	case ptic_ptwrite:
		return 1;
	}
}